

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void run_container_offset(run_container_t *c,container_t **loc,container_t **hic,uint16_t offset)

{
  bool bVar1;
  int iVar2;
  ushort in_CX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  int *in_RDI;
  int i_1;
  int i;
  int pivot;
  int top;
  int hi_cap;
  int lo_cap;
  _Bool split;
  run_container_t *hi;
  run_container_t *lo;
  int32_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffbc;
  int local_3c;
  int local_38;
  run_container_t *local_30;
  run_container_t *local_28;
  
  local_28 = (run_container_t *)0x0;
  local_30 = (run_container_t *)0x0;
  iVar2 = run_container_index_equalorlarger
                    ((run_container_t *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (uint16_t)((uint)in_stack_ffffffffffffffb4 >> 0x10));
  if (iVar2 == -1) {
    bVar1 = false;
    local_38 = *in_RDI;
    local_3c = 0;
  }
  else {
    bVar1 = (int)(uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)iVar2 * 4) <
            (int)(0x10000 - (uint)in_CX);
    local_38 = iVar2 + (uint)bVar1;
    local_3c = *in_RDI - iVar2;
  }
  if ((in_RSI != (undefined8 *)0x0) && (local_38 != 0)) {
    local_28 = run_container_create_given_capacity(in_stack_ffffffffffffffac);
    memcpy(local_28->runs,*(void **)(in_RDI + 2),(long)local_38 << 2);
    local_28->n_runs = local_38;
    for (iVar3 = 0; iVar3 < local_38; iVar3 = iVar3 + 1) {
      local_28->runs[iVar3].value = local_28->runs[iVar3].value + in_CX;
    }
    *in_RSI = local_28;
  }
  if ((in_RDX != (undefined8 *)0x0) && (local_3c != 0)) {
    local_30 = run_container_create_given_capacity(in_stack_ffffffffffffffac);
    memcpy(local_30->runs,(void *)(*(long *)(in_RDI + 2) + (long)iVar2 * 4),(long)local_3c << 2);
    local_30->n_runs = local_3c;
    for (iVar2 = 0; iVar2 < local_3c; iVar2 = iVar2 + 1) {
      local_30->runs[iVar2].value = local_30->runs[iVar2].value + in_CX;
    }
    *in_RDX = local_30;
  }
  if (bVar1) {
    if (local_28 != (run_container_t *)0x0) {
      local_28->runs[local_28->n_runs + -1].length =
           0xffff - local_28->runs[local_28->n_runs + -1].value;
    }
    if (local_30 != (run_container_t *)0x0) {
      local_30->runs->length = local_30->runs->length + local_30->runs->value;
      local_30->runs->value = 0;
    }
  }
  return;
}

Assistant:

void run_container_offset(const run_container_t *c, container_t **loc,
                          container_t **hic, uint16_t offset) {
    run_container_t *lo = NULL, *hi = NULL;

    bool split;
    int lo_cap, hi_cap;
    int top, pivot;

    top = (1 << 16) - offset;
    pivot = run_container_index_equalorlarger(c, top);

    if (pivot == -1) {
        split = false;
        lo_cap = c->n_runs;
        hi_cap = 0;
    } else {
        split = c->runs[pivot].value < top;
        lo_cap = pivot + (split ? 1 : 0);
        hi_cap = c->n_runs - pivot;
    }

    if (loc && lo_cap) {
        lo = run_container_create_given_capacity(lo_cap);
        memcpy(lo->runs, c->runs, lo_cap * sizeof(rle16_t));
        lo->n_runs = lo_cap;
        for (int i = 0; i < lo_cap; ++i) {
            lo->runs[i].value += offset;
        }
        *loc = (container_t *)lo;
    }

    if (hic && hi_cap) {
        hi = run_container_create_given_capacity(hi_cap);
        memcpy(hi->runs, c->runs + pivot, hi_cap * sizeof(rle16_t));
        hi->n_runs = hi_cap;
        for (int i = 0; i < hi_cap; ++i) {
            hi->runs[i].value += offset;
        }
        *hic = (container_t *)hi;
    }

    // Fix the split.
    if (split) {
        if (lo != NULL) {
            // Add the missing run to 'lo', exhausting length.
            lo->runs[lo->n_runs - 1].length =
                (1 << 16) - lo->runs[lo->n_runs - 1].value - 1;
        }

        if (hi != NULL) {
            // Fix the first run in 'hi'.
            hi->runs[0].length -= UINT16_MAX - hi->runs[0].value + 1;
            hi->runs[0].value = 0;
        }
    }
}